

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O0

void __thiscall Path::arc_to(Path *this,Point r,float rotation,bool large_arc,bool sweep,Point *end)

{
  double dVar1;
  Point local_1b4;
  Transformation local_1ac;
  Transformation local_194;
  Transformation local_17c;
  Transformation local_164;
  undefined1 local_14c [8];
  Transformation t;
  float sweep_angle;
  Point local_128;
  Transformation local_120;
  Point local_108;
  float local_100;
  Point PStack_fc;
  float end_angle;
  Transformation local_f4;
  Point local_dc;
  float local_d4;
  Point PStack_d0;
  float start_angle;
  Point local_c8;
  Transformation local_c0;
  Point local_a8;
  Point local_a0;
  Point center;
  Point local_90;
  Point local_88;
  float local_80;
  Point PStack_7c;
  float denominator;
  float local_74;
  Point PStack_70;
  float numerator;
  Point c;
  Point local_60;
  Transformation local_58;
  Point local_40;
  Point p;
  Point *start;
  Point *end_local;
  bool sweep_local;
  bool large_arc_local;
  float rotation_local;
  Path *this_local;
  Point r_local;
  
  this_local._0_4_ = r.x;
  this_local = (Path *)r;
  if ((this_local._0_4_ != 0.0) || (NAN(this_local._0_4_))) {
    this_local._4_4_ = r.y;
    if ((this_local._4_4_ != 0.0) || (NAN(this_local._4_4_))) {
      p = current_point(this);
      Transformation::rotate(&local_58,-rotation);
      c = Point::operator-(&p,end);
      local_60 = Point::operator*(&c,0.5);
      local_40 = ::operator*(&local_58,&local_60);
      Point::Point(&stack0xffffffffffffff90,0.0,0.0);
      local_74 = -(this_local._4_4_ * this_local._4_4_ * local_40.x) * local_40.x +
                 this_local._0_4_ * this_local._0_4_ * this_local._4_4_ * this_local._4_4_ +
                 -(this_local._0_4_ * this_local._0_4_ * local_40.y * local_40.y);
      if (0.0 <= local_74) {
        local_80 = this_local._0_4_ * this_local._0_4_ * local_40.y * local_40.y +
                   this_local._4_4_ * this_local._4_4_ * local_40.x * local_40.x;
        Point::Point(&local_90,(this_local._0_4_ * local_40.y) / this_local._4_4_,
                     (-this_local._4_4_ * local_40.x) / this_local._0_4_);
        dVar1 = std::sqrt((double)(ulong)(uint)(local_74 / local_80));
        local_88 = Point::operator*(&local_90,SUB84(dVar1,0));
        PStack_70 = local_88;
        if (large_arc == sweep) {
          center = Point::operator*(&stack0xffffffffffffff90,-1.0);
          PStack_70 = center;
        }
      }
      else {
        dVar1 = std::sqrt((double)(ulong)(uint)(1.0 - local_74 /
                                                      (this_local._0_4_ * this_local._0_4_ *
                                                       this_local._4_4_ * this_local._4_4_)));
        PStack_7c = Point::operator*((Point *)&this_local,SUB84(dVar1,0));
        this_local = (Path *)PStack_7c;
      }
      Transformation::rotate(&local_c0,rotation);
      local_a8 = ::operator*(&local_c0,&stack0xffffffffffffff90);
      PStack_d0 = Point::operator+(&p,end);
      local_c8 = Point::operator*(&stack0xffffffffffffff30,0.5);
      local_a0 = Point::operator+(&local_a8,&local_c8);
      Transformation::scale(&local_f4,1.0 / this_local._0_4_,1.0 / this_local._4_4_);
      PStack_fc = Point::operator-(&local_40,&stack0xffffffffffffff90);
      local_dc = ::operator*(&local_f4,&stack0xffffffffffffff04);
      local_d4 = angle(&local_dc);
      Transformation::scale(&local_120,1.0 / this_local._0_4_,1.0 / this_local._4_4_);
      register0x00001200 = Point::operator-(&local_40);
      local_128 = Point::operator-((Point *)&t.f,&stack0xffffffffffffff90);
      local_108 = ::operator*(&local_120,&local_128);
      local_100 = angle(&local_108);
      t.e = local_100 - local_d4;
      if ((sweep) || (t.e <= 0.0)) {
        if ((sweep) && (t.e < 0.0)) {
          t.e = t.e + 6.2831855;
        }
      }
      else {
        t.e = t.e - 6.2831855;
      }
      Transformation::translate(&local_17c,local_a0.x,local_a0.y);
      Transformation::rotate(&local_194,rotation);
      ::operator*(&local_164,&local_17c,&local_194);
      Transformation::scale(&local_1ac,this_local._0_4_,this_local._4_4_);
      ::operator*((Transformation *)local_14c,&local_164,&local_1ac);
      Point::Point(&local_1b4,0.0,0.0);
      add_arc(this,&local_1b4,1.0,local_d4,t.e,(Transformation *)local_14c);
      return;
    }
  }
  line_to(this,end);
  return;
}

Assistant:

void arc_to(Point r, float rotation, bool large_arc, bool sweep, const Point& end) {
		if (r.x == 0.f || r.y == 0.f) {
			line_to(end);
			return;
		}
		const Point& start = current_point();
		const Point p = Transformation::rotate(-rotation) * ((start - end) * .5f);
		Point c(0.f, 0.f);
		const float numerator = (r.x*r.x * r.y*r.y - r.x*r.x * p.y*p.y - r.y*r.y * p.x*p.x);
		if (numerator < 0.f) {
			r = r * std::sqrt(1.f - numerator / (r.x*r.x * r.y*r.y));
		}
		else {
			const float denominator = (r.x*r.x * p.y*p.y + r.y*r.y * p.x*p.x);
			c = Point(r.x*p.y/r.y, -r.y*p.x/r.x) * std::sqrt(numerator / denominator);
			if (large_arc == sweep) {
				c = c * -1.f;
			}
		}
		const Point center = Transformation::rotate(rotation) * c + (start + end) * .5f;
		const float start_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (p - c));
		const float end_angle = angle(Transformation::scale(1.f / r.x, 1.f / r.y) * (-p - c));
		float sweep_angle = end_angle - start_angle;
		if (sweep == false && sweep_angle > 0.f) {
			sweep_angle -= 2.f * M_PI;
		}
		else if (sweep == true && sweep_angle < 0.f) {
			sweep_angle += 2.f * M_PI;
		}
		const Transformation t = Transformation::translate(center.x, center.y) * Transformation::rotate(rotation) * Transformation::scale(r.x, r.y);
		add_arc(Point(0.f, 0.f), 1.f, start_angle, sweep_angle, t);
	}